

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecProgramCommand.cxx
# Opt level: O3

bool cmExecProgramCommand::RunCommand
               (char *command,string *output,int *retVal,char *dir,bool verbose,Encoding encoding)

{
  pointer pcVar1;
  bool bVar2;
  char *s;
  uint uVar3;
  int iVar4;
  cmsysProcess *cp;
  byte bVar5;
  cmProcessOutput processOutput;
  int length;
  string commandInDir;
  string strdata;
  char *data;
  string msg;
  char *cmd [4];
  cmProcessOutput local_115;
  int local_114;
  int *local_110;
  string *local_108;
  char *local_100;
  undefined8 local_f8;
  char local_f0;
  undefined7 uStack_ef;
  string local_e0;
  char *local_c0;
  undefined1 *local_b8;
  long local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  string local_98;
  string local_78;
  char *local_58;
  char *local_50;
  char *local_48;
  undefined8 local_40;
  
  bVar2 = cmSystemTools::s_DisableRunCommandOutput;
  local_110 = retVal;
  local_108 = output;
  cp = cmsysProcess_New();
  if (cp == (cmsysProcess *)0x0) {
    cmSystemTools::Error("Error allocating process instance.",(char *)0x0,(char *)0x0,(char *)0x0);
    goto LAB_003415b9;
  }
  local_100 = &local_f0;
  local_f8 = 0;
  local_f0 = '\0';
  if (dir == (char *)0x0) {
    strlen(command);
    std::__cxx11::string::_M_replace((ulong)&local_100,0,(char *)0x0,(ulong)command);
  }
  else {
    std::__cxx11::string::_M_replace((ulong)&local_100,0,(char *)0x0,0x5c1ef0);
    std::__cxx11::string::append((char *)&local_100);
    std::__cxx11::string::append((char *)&local_100);
    std::__cxx11::string::append((char *)&local_100);
  }
  std::__cxx11::string::append((char *)&local_100);
  s = local_100;
  bVar5 = ~bVar2 & verbose;
  if (bVar5 != 0) {
    cmSystemTools::Stdout("running ");
    cmSystemTools::Stdout(s);
    cmSystemTools::Stdout("\n");
  }
  fflush(_stdout);
  fflush(_stderr);
  local_58 = "/bin/sh";
  local_50 = "-c";
  local_48 = s;
  local_40 = 0;
  cmsysProcess_SetCommand(cp,&local_58);
  cmsysProcess_Execute(cp);
  cmProcessOutput::cmProcessOutput(&local_115,encoding,0x400);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  local_e0._M_string_length = 0;
  local_e0.field_2._M_local_buf[0] = '\0';
  while (uVar3 = cmsysProcess_WaitForData(cp,&local_c0,&local_114,(double *)0x0), uVar3 != 0) {
    if ((uVar3 & 0xfffffffe) == 2) {
      if (bVar5 != 0) {
        cmProcessOutput::DecodeText(&local_115,local_c0,(long)local_114,&local_e0,0);
        cmSystemTools::Stdout(local_e0._M_dataplus._M_p,local_e0._M_string_length);
      }
      std::__cxx11::string::append((char *)local_108,(ulong)local_c0);
    }
  }
  if (bVar5 != 0) {
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    cmProcessOutput::DecodeText(&local_115,&local_78,&local_e0,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                               local_78.field_2._M_local_buf[0]) + 1);
    }
    if (local_e0._M_string_length != 0) {
      cmSystemTools::Stdout(local_e0._M_dataplus._M_p,local_e0._M_string_length);
    }
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  pcVar1 = (local_108->_M_dataplus)._M_p;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar1,pcVar1 + local_108->_M_string_length);
  cmProcessOutput::DecodeText(&local_115,&local_98,local_108,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_b0 = 0;
  local_a8 = 0;
  local_b8 = &local_a8;
  iVar4 = cmsysProcess_GetState(cp);
  switch(iVar4) {
  case 1:
    *local_110 = -1;
    std::__cxx11::string::append((char *)&local_b8);
    cmsysProcess_GetErrorString(cp);
    goto LAB_00341514;
  case 2:
    *local_110 = -1;
    std::__cxx11::string::append((char *)&local_b8);
    cmsysProcess_GetExceptionString(cp);
LAB_00341514:
    std::__cxx11::string::append((char *)&local_b8);
    break;
  case 4:
    iVar4 = cmsysProcess_GetExitValue(cp);
    *local_110 = iVar4;
    break;
  case 5:
    *local_110 = -1;
    std::__cxx11::string::append((char *)&local_b8);
  }
  if (local_b0 != 0) {
    std::__cxx11::string::_M_append((char *)local_108,(ulong)local_b8);
  }
  cmsysProcess_Delete(cp);
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                             local_e0.field_2._M_local_buf[0]) + 1);
  }
  cmProcessOutput::~cmProcessOutput(&local_115);
  if (local_100 != &local_f0) {
    operator_delete(local_100,CONCAT71(uStack_ef,local_f0) + 1);
  }
LAB_003415b9:
  return cp != (cmsysProcess *)0x0;
}

Assistant:

bool cmExecProgramCommand::RunCommand(const char* command, std::string& output,
                                      int& retVal, const char* dir,
                                      bool verbose, Encoding encoding)
{
  if (cmSystemTools::GetRunCommandOutput()) {
    verbose = false;
  }

#if defined(_WIN32) && !defined(__CYGWIN__)
  // if the command does not start with a quote, then
  // try to find the program, and if the program can not be
  // found use system to run the command as it must be a built in
  // shell command like echo or dir
  int count = 0;
  std::string shortCmd;
  if (command[0] == '\"') {
    // count the number of quotes
    for (const char* s = command; *s != 0; ++s) {
      if (*s == '\"') {
        count++;
        if (count > 2) {
          break;
        }
      }
    }
    // if there are more than two double quotes use
    // GetShortPathName, the cmd.exe program in windows which
    // is used by system fails to execute if there are more than
    // one set of quotes in the arguments
    if (count > 2) {
      cmsys::RegularExpression quoted("^\"([^\"]*)\"[ \t](.*)");
      if (quoted.find(command)) {
        std::string cmd = quoted.match(1);
        std::string args = quoted.match(2);
        if (!cmSystemTools::FileExists(cmd.c_str())) {
          shortCmd = cmd;
        } else if (!cmSystemTools::GetShortPath(cmd.c_str(), shortCmd)) {
          cmSystemTools::Error("GetShortPath failed for ", cmd.c_str());
          return false;
        }
        shortCmd += " ";
        shortCmd += args;

        command = shortCmd.c_str();
      } else {
        cmSystemTools::Error("Could not parse command line with quotes ",
                             command);
      }
    }
  }
#endif

  // Allocate a process instance.
  cmsysProcess* cp = cmsysProcess_New();
  if (!cp) {
    cmSystemTools::Error("Error allocating process instance.");
    return false;
  }

#if defined(_WIN32) && !defined(__CYGWIN__)
  if (dir) {
    cmsysProcess_SetWorkingDirectory(cp, dir);
  }
  if (cmSystemTools::GetRunCommandHideConsole()) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  }
  cmsysProcess_SetOption(cp, cmsysProcess_Option_Verbatim, 1);
  const char* cmd[] = { command, 0 };
  cmsysProcess_SetCommand(cp, cmd);
#else
  std::string commandInDir;
  if (dir) {
    commandInDir = "cd \"";
    commandInDir += dir;
    commandInDir += "\" && ";
    commandInDir += command;
  } else {
    commandInDir = command;
  }
#ifndef __VMS
  commandInDir += " 2>&1";
#endif
  command = commandInDir.c_str();
  if (verbose) {
    cmSystemTools::Stdout("running ");
    cmSystemTools::Stdout(command);
    cmSystemTools::Stdout("\n");
  }
  fflush(stdout);
  fflush(stderr);
  const char* cmd[] = { "/bin/sh", "-c", command, CM_NULLPTR };
  cmsysProcess_SetCommand(cp, cmd);
#endif

  cmsysProcess_Execute(cp);

  // Read the process output.
  int length;
  char* data;
  int p;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  while ((p = cmsysProcess_WaitForData(cp, &data, &length, CM_NULLPTR), p)) {
    if (p == cmsysProcess_Pipe_STDOUT || p == cmsysProcess_Pipe_STDERR) {
      if (verbose) {
        processOutput.DecodeText(data, length, strdata);
        cmSystemTools::Stdout(strdata.c_str(), strdata.size());
      }
      output.append(data, length);
    }
  }

  if (verbose) {
    processOutput.DecodeText(std::string(), strdata);
    if (!strdata.empty()) {
      cmSystemTools::Stdout(strdata.c_str(), strdata.size());
    }
  }

  // All output has been read.  Wait for the process to exit.
  cmsysProcess_WaitForExit(cp, CM_NULLPTR);
  processOutput.DecodeText(output, output);

  // Check the result of running the process.
  std::string msg;
  switch (cmsysProcess_GetState(cp)) {
    case cmsysProcess_State_Exited:
      retVal = cmsysProcess_GetExitValue(cp);
      break;
    case cmsysProcess_State_Exception:
      retVal = -1;
      msg += "\nProcess terminated due to: ";
      msg += cmsysProcess_GetExceptionString(cp);
      break;
    case cmsysProcess_State_Error:
      retVal = -1;
      msg += "\nProcess failed because: ";
      msg += cmsysProcess_GetErrorString(cp);
      break;
    case cmsysProcess_State_Expired:
      retVal = -1;
      msg += "\nProcess terminated due to timeout.";
      break;
  }
  if (!msg.empty()) {
#if defined(_WIN32) && !defined(__CYGWIN__)
    // Old Windows process execution printed this info.
    msg += "\n\nfor command: ";
    msg += command;
    if (dir) {
      msg += "\nin dir: ";
      msg += dir;
    }
    msg += "\n";
    if (verbose) {
      cmSystemTools::Stdout(msg.c_str());
    }
    output += msg;
#else
    // Old UNIX process execution only put message in output.
    output += msg;
#endif
  }

  // Delete the process instance.
  cmsysProcess_Delete(cp);

  return true;
}